

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaError PaUtil_DeviceIndexToHostApiDeviceIndex
                  (PaDeviceIndex *hostApiDevice,PaDeviceIndex device,
                  PaUtilHostApiRepresentation *hostApi)

{
  PaError PVar1;
  int iVar2;
  
  iVar2 = device - (int)(hostApi->privatePaFrontInfo).baseDeviceIndex;
  PVar1 = -0x270c;
  if ((-1 < iVar2) && (iVar2 < (hostApi->info).deviceCount)) {
    *hostApiDevice = iVar2;
    PVar1 = 0;
  }
  return PVar1;
}

Assistant:

PaError PaUtil_DeviceIndexToHostApiDeviceIndex(
        PaDeviceIndex *hostApiDevice, PaDeviceIndex device, struct PaUtilHostApiRepresentation *hostApi )
{
    PaError result;
    PaDeviceIndex x;

    x = device - hostApi->privatePaFrontInfo.baseDeviceIndex;

    if( x < 0 || x >= hostApi->info.deviceCount )
    {
        result = paInvalidDevice;
    }
    else
    {
        *hostApiDevice = x;
        result = paNoError;
    }

    return result;
}